

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

void __thiscall CVmObjStringBuffer::save_to_file(CVmObjStringBuffer *this,CVmFile *fp)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  
  puVar2 = (uint *)(this->super_CVmObject).ext_;
  CVmFile::write_uint4(fp,puVar2[1]);
  CVmFile::write_uint4(fp,puVar2[2]);
  CVmFile::write_uint4(fp,*puVar2);
  uVar1 = *puVar2;
  for (lVar3 = 0; uVar1 != (uint)lVar3; lVar3 = lVar3 + 1) {
    CVmFile::write_uint2(fp,puVar2[lVar3 + 3]);
  }
  return;
}

Assistant:

void CVmObjStringBuffer::save_to_file(VMG_ class CVmFile *fp)
{
    vm_strbuf_ext *ext = get_ext();

    /* write our allocation and string length data */
    fp->write_uint4(ext->alo);
    fp->write_uint4(ext->inc);
    fp->write_uint4(ext->len);

    /* write the string contents */
    const wchar_t *src;
    int i;
    for (i = ext->len, src = ext->buf ; i != 0 ; --i)
        fp->write_uint2(*src++);
}